

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaPropertyBuilderPrivate::~QMetaPropertyBuilderPrivate(QMetaPropertyBuilderPrivate *this)

{
  QByteArray::~QByteArray((QByteArray *)0x37a7f0);
  QByteArray::~QByteArray((QByteArray *)0x37a7fa);
  return;
}

Assistant:

QMetaPropertyBuilderPrivate
            (const QByteArray& _name, const QByteArray& _type, QMetaType _metaType, int notifierIdx=-1,
             int _revision = 0)
        : name(_name),
          type(QMetaObject::normalizedType(_type.constData())),
          metaType(_metaType),
          flags(Readable | Writable | Scriptable), notifySignal(notifierIdx),
          revision(_revision)
    {

    }